

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InliningDecider.cpp
# Opt level: O3

bool __thiscall InliningDecider::InlineIntoTopFunc(InliningDecider *this)

{
  FunctionBody *pFVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  FunctionInfo *pFVar6;
  
  if (this->jitMode != SimpleJit) {
    uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
    pFVar1 = this->topFunc;
    pFVar6 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar6 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar3) goto LAB_0055b9b7;
      *puVar5 = 0;
      pFVar6 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,InlinePhase,uVar4,pFVar6->functionId);
    if (!bVar3) {
      uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
      pFVar1 = this->topFunc;
      pFVar6 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      if (pFVar6 == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                           ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar3) {
LAB_0055b9b7:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
        pFVar6 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,GlobOptPhase,uVar4,pFVar6->functionId);
      if (!bVar3) {
        bVar3 = InlineIntoInliner(this,this->topFunc);
        return bVar3;
      }
    }
  }
  return false;
}

Assistant:

bool InliningDecider::InlineIntoTopFunc() const
{
    if (this->jitMode == ExecutionMode::SimpleJit ||
        PHASE_OFF(Js::InlinePhase, this->topFunc) ||
        PHASE_OFF(Js::GlobOptPhase, this->topFunc))
    {
        return false;
    }
#ifdef _M_IX86
    if (this->topFunc->GetHasTry())
    {
#if defined(DBG_DUMP) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: Has try\tCaller: %s (%s)\n"), this->topFunc->GetDisplayName(),
        this->topFunc->GetDebugNumberSet(debugStringBuffer));
        // Glob opt doesn't run on function with try, so we can't generate bailout for it
        return false;
    }
#endif

    return InlineIntoInliner(topFunc);
}